

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.cpp
# Opt level: O3

void __thiscall cube::http::HTTPClient::~HTTPClient(HTTPClient *this)

{
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->m_idle_conns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_idle_conns)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    while (p_Var1[3]._M_parent != (_Base_ptr)0x0) {
      net::TcpConnection::Close((TcpConnection *)(p_Var1[2]._M_right[1]._M_parent)->_M_right);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>_>
  ::clear(&(this->m_idle_conns)._M_t);
  if ((this->m_requesting_conns)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    __assert_fail("m_requesting_conns.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/http/http_client.cpp"
                  ,0x1e,"cube::http::HTTPClient::~HTTPClient()");
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->m_timeouts)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>
  ::~_Rb_tree(&(this->m_requesting_conns)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>_>
  ::~_Rb_tree(&(this->m_idle_conns)._M_t);
  return;
}

Assistant:

HTTPClient::~HTTPClient() {
    // close all connections
    //auto idle_conns = std::move(m_idle_conns);
    for (auto it = m_idle_conns.begin(); it != m_idle_conns.end(); it++) {
        while (!it->second.empty()) {
            it->second.begin()->second->Close();
        }
    }
    m_idle_conns.clear();

    assert(m_requesting_conns.empty());
}